

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

string * __thiscall
GLRParser::symbolAfterMarker_abi_cxx11_
          (string *__return_storage_ptr__,GLRParser *this,Production *production)

{
  pointer pbVar1;
  pointer pcVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  string *var;
  pointer pbVar6;
  bool bVar7;
  string symbol;
  uint7 uStack_5f;
  undefined8 uStack_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pvVar5 = Production::getToP_abi_cxx11_((Production *)this);
  pbVar6 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar1) {
    bVar3 = false;
    do {
      if (bVar3) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (pbVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar6->_M_string_length);
        bVar7 = bVar3;
      }
      else {
        getMarker_abi_cxx11_();
        __n = pbVar6->_M_string_length;
        if (__n == local_48) {
          if (__n == 0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp((pbVar6->_M_dataplus)._M_p,local_50,__n);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      if (bVar3) {
        return __return_storage_ptr__;
      }
      pbVar6 = pbVar6 + 1;
      bVar3 = bVar7;
    } while (pbVar6 != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (ulong)uStack_5f << 8;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
  __return_storage_ptr__->_M_string_length = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string GLRParser::symbolAfterMarker(const Production *production) {
    std::string symbol;
    bool previousmarker = false;
    for (const std::string &var: production->getToP()) {
        if (previousmarker) {
            return var;
        }
        previousmarker = (var == getMarker());
    }
    return symbol;
}